

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

int __thiscall
ncnn::Split::forward
          (Split *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs)

{
  Mat *pMVar1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  size_t i;
  Mat *bottom_blob;
  Mat *m;
  Mat *this_00;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  m = (Mat *)0x0;
  while( true ) {
    this_00 = m;
    pMVar1 = (Mat *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(in_RDX);
    if (pMVar1 <= m) break;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(size_type)this_00);
    Mat::operator=(this_00,m);
    m = (Mat *)((long)&this_00->data + 1);
  }
  return 0;
}

Assistant:

int Split::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    for (size_t i=0; i<top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blob;
    }

    return 0;
}